

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_dbxx(m68k_info *info,int opcode,int size,int displacement)

{
  cs_m68k *pcVar1;
  int32_t in_ECX;
  m68k_info *in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  
  pcVar1 = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8,
                         (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  pcVar1->operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[0].field_0.reg = (in_RDI->ir & 7) + M68K_REG_D0;
  pcVar1->operands[1].type = M68K_OP_BR_DISP;
  pcVar1->operands[1].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  pcVar1->operands[1].br_disp.disp = in_ECX;
  pcVar1->operands[1].br_disp.disp_size = '\x04';
  set_insn_group(in_RDI,M68K_GRP_JUMP);
  set_insn_group(in_RDI,M68K_GRP_BRANCH_RELATIVE);
  return;
}

Assistant:

static void build_dbxx(m68k_info *info, int opcode, int size, int displacement)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (info->ir & 7);

	op1->type = M68K_OP_BR_DISP;
	op1->address_mode = M68K_AM_BRANCH_DISPLACEMENT;
	op1->br_disp.disp = displacement;
	op1->br_disp.disp_size = M68K_OP_BR_DISP_SIZE_LONG;

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}